

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O1

char * ucnv_getStandardName_63(char *alias,char *standard,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint32_t uVar2;
  undefined4 extraout_var;
  char *pcVar3;
  bool bVar4;
  
  UVar1 = haveAliasData(pErrorCode);
  if (UVar1 != '\0') {
    if (alias == (char *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if (*alias != '\0') {
      uVar2 = findTaggedAliasListsOffset(alias,standard,pErrorCode);
      pcVar3 = (char *)CONCAT44(extraout_var,uVar2);
      bVar4 = true;
      if ((uVar2 != 0) && (uVar2 < gMainTable.taggedAliasListsSize)) {
        bVar4 = gMainTable.taggedAliasLists[(ulong)uVar2 + 1] == 0;
        pcVar3 = (char *)((ulong)((uint)gMainTable.taggedAliasLists[(ulong)uVar2 + 1] * 2) +
                         (long)gMainTable.stringTable);
      }
      if (!bVar4) {
        return pcVar3;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

U_CAPI const char * U_EXPORT2
ucnv_getStandardName(const char *alias, const char *standard, UErrorCode *pErrorCode) {
    if (haveAliasData(pErrorCode) && isAlias(alias, pErrorCode)) {
        uint32_t listOffset = findTaggedAliasListsOffset(alias, standard, pErrorCode);

        if (0 < listOffset && listOffset < gMainTable.taggedAliasListsSize) {
            const uint16_t *currList = gMainTable.taggedAliasLists + listOffset + 1;

            /* Get the preferred name from this list */
            if (currList[0]) {
                return GET_STRING(currList[0]);
            }
            /* else someone screwed up the alias table. */
            /* *pErrorCode = U_INVALID_FORMAT_ERROR */
        }
    }

    return NULL;
}